

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlAttrPtr xmlSetNsProp(xmlNodePtr node,xmlNsPtr ns,xmlChar *name,xmlChar *value)

{
  _xmlDoc *p_Var1;
  int iVar2;
  _xmlNode *attr;
  _xmlNode *p_Var3;
  xmlAttrPtr pxVar4;
  xmlChar *nsName;
  _xmlNode *p_Var5;
  
  if (ns == (xmlNsPtr)0x0) {
    nsName = (xmlChar *)0x0;
    if (name == (xmlChar *)0x0) {
      return (xmlAttrPtr)0x0;
    }
  }
  else {
    nsName = ns->href;
    if (name == (xmlChar *)0x0 || nsName == (xmlChar *)0x0) {
      return (xmlAttrPtr)0x0;
    }
  }
  attr = (_xmlNode *)xmlGetPropNodeInternal(node,name,nsName,0);
  if (attr == (_xmlNode *)0x0) {
    pxVar4 = xmlNewPropInternal(node,ns,name,value,0);
    return pxVar4;
  }
  if (value == (xmlChar *)0x0) {
    p_Var3 = (_xmlNode *)0x0;
  }
  else {
    p_Var1 = node->doc;
    p_Var3 = xmlNewText(value);
    if (p_Var3 == (xmlNodePtr)0x0) {
      return (xmlAttrPtr)0x0;
    }
    p_Var3->doc = p_Var1;
  }
  if (*(xmlAttributeType *)&attr->content == XML_ATTRIBUTE_ID) {
    xmlRemoveID(node->doc,(xmlAttrPtr)attr);
    *(xmlAttributeType *)&attr->content = XML_ATTRIBUTE_ID;
  }
  if (attr->children != (xmlNodePtr)0x0) {
    xmlFreeNodeList(attr->children);
  }
  attr->children = (_xmlNode *)0x0;
  attr->last = (_xmlNode *)0x0;
  attr->ns = ns;
  if ((value != (xmlChar *)0x0) && (attr->children = p_Var3, p_Var3 != (_xmlNode *)0x0)) {
    do {
      p_Var5 = p_Var3;
      p_Var5->parent = attr;
      p_Var3 = p_Var5->next;
    } while (p_Var5->next != (_xmlNode *)0x0);
    attr->last = p_Var5;
  }
  if (*(int *)&attr->content == 2) {
    iVar2 = xmlAddIDSafe((xmlAttrPtr)attr,value);
    if (iVar2 < 0) {
      return (xmlAttrPtr)0x0;
    }
    return (xmlAttrPtr)attr;
  }
  return (xmlAttrPtr)attr;
}

Assistant:

xmlAttrPtr
xmlSetNsProp(xmlNodePtr node, xmlNsPtr ns, const xmlChar *name,
	     const xmlChar *value)
{
    xmlAttrPtr prop;

    if (ns && (ns->href == NULL))
	return(NULL);
    if (name == NULL)
        return(NULL);
    prop = xmlGetPropNodeInternal(node, name,
                                  (ns != NULL) ? ns->href : NULL, 0);
    if (prop != NULL) {
        xmlNodePtr children = NULL;

	/*
	* Modify the attribute's value.
	*/
        if (value != NULL) {
	    children = xmlNewDocText(node->doc, value);
            if (children == NULL)
                return(NULL);
        }

	if (prop->atype == XML_ATTRIBUTE_ID) {
	    xmlRemoveID(node->doc, prop);
	    prop->atype = XML_ATTRIBUTE_ID;
	}
	if (prop->children != NULL)
	    xmlFreeNodeList(prop->children);
	prop->children = NULL;
	prop->last = NULL;
	prop->ns = ns;
	if (value != NULL) {
	    xmlNodePtr tmp;

	    prop->children = children;
	    prop->last = NULL;
	    tmp = prop->children;
	    while (tmp != NULL) {
		tmp->parent = (xmlNodePtr) prop;
		if (tmp->next == NULL)
		    prop->last = tmp;
		tmp = tmp->next;
	    }
	}
	if ((prop->atype == XML_ATTRIBUTE_ID) &&
	    (xmlAddIDSafe(prop, value) < 0)) {
            return(NULL);
        }
	return(prop);
    }
    /*
    * No equal attr found; create a new one.
    */
    return(xmlNewPropInternal(node, ns, name, value, 0));
}